

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

DiffuseMaterial *
pbrt::DiffuseMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  DiffuseMaterial *pDVar2;
  memory_resource *in_RDX;
  TextureParameterDictionary *in_RDI;
  FloatTextureHandle displacement;
  FloatTextureHandle sigma;
  SpectrumTextureHandle reflectance;
  SpectrumTextureHandle *in_stack_fffffffffffffed8;
  SpectrumHandle *in_stack_fffffffffffffee0;
  ConstantSpectrum **in_stack_fffffffffffffee8;
  FloatTextureHandle *args_2;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  SpectrumType spectrumType;
  string *name;
  Allocator alloc_00;
  TextureParameterDictionary *in_stack_ffffffffffffff10;
  Allocator in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff38;
  TextureParameterDictionary *in_stack_ffffffffffffff40;
  undefined1 local_a9 [45];
  undefined4 local_7c;
  ConstantSpectrum *local_78;
  memory_resource *local_68;
  undefined1 local_41 [33];
  TaggedPointer local_20 [16];
  TextureParameterDictionary *local_10;
  memory_resource *local_8;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  alloc_00.memoryResource = (memory_resource *)local_41;
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18.memoryResource,
             (allocator<char> *)in_stack_ffffffffffffff10);
  SpectrumHandle::TaggedPointer(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_68 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_ffffffffffffff10,(string *)alloc_00.memoryResource,(SpectrumHandle *)in_RDI,
             spectrumType,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
  if (!bVar1) {
    local_7c = 0x3f000000;
    local_78 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                         (in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTextureHandle *)in_stack_fffffffffffffee0,
               (SpectrumConstantTexture *)in_stack_fffffffffffffed8);
    SpectrumTextureHandle::operator=
              ((SpectrumTextureHandle *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  name = (string *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18.memoryResource,
             (allocator<char> *)in_stack_ffffffffffffff10);
  TextureParameterDictionary::GetFloatTexture(in_RDI,name,(Float)((ulong)local_10 >> 0x20),alloc_00)
  ;
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  args_2 = (FloatTextureHandle *)&stack0xffffffffffffff1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18.memoryResource,
             (allocator<char> *)in_stack_ffffffffffffff10);
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(Allocator)local_8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  pDVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DiffuseMaterial,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
                     ((polymorphic_allocator<std::byte> *)in_RDI,(SpectrumTextureHandle *)name,
                      (FloatTextureHandle *)local_10,args_2);
  return pDVar2;
}

Assistant:

DiffuseMaterial *DiffuseMaterial::Create(const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Reflectance, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));
    FloatTextureHandle sigma = parameters.GetFloatTexture("sigma", 0.f, alloc);
    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    return alloc.new_object<DiffuseMaterial>(reflectance, sigma, displacement);
}